

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_resize2.h
# Opt level: O2

void stbir__encode_uint8_srgb(void *outputp,int width_times_channels,float *encode)

{
  stbir_uint8 *psVar1;
  undefined1 (*pauVar2) [16];
  undefined1 (*pauVar3) [16];
  undefined1 (*pauVar4) [16];
  stbir_uint8 *psVar5;
  undefined1 (*pauVar6) [16];
  undefined1 (*pauVar7) [16];
  undefined1 (*pauVar8) [16];
  undefined1 (*pauVar9) [16];
  undefined1 (*pauVar10) [16];
  undefined1 (*pauVar11) [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  stbir_uint8 sVar16;
  undefined1 (*pauVar17) [16];
  stbir_uint8 *psVar18;
  short sVar19;
  short sVar20;
  short sVar21;
  short sVar22;
  short sVar28;
  short sVar29;
  short sVar30;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  short sVar31;
  short sVar32;
  short sVar37;
  short sVar38;
  short sVar39;
  short sVar40;
  short sVar41;
  short sVar42;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  short sVar43;
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  
  auVar15 = _DAT_0049a840;
  auVar14 = _DAT_0049a830;
  auVar13 = _DAT_0049a820;
  auVar12 = _DAT_0049a810;
  psVar5 = (stbir_uint8 *)((long)outputp + (long)width_times_channels);
  if (width_times_channels < 0x10) {
    while ((stbir_uint8 *)((long)outputp + 4) <= psVar5) {
      sVar16 = stbir__linear_to_srgb_uchar(*encode);
      *(stbir_uint8 *)outputp = sVar16;
      sVar16 = stbir__linear_to_srgb_uchar(encode[1]);
      *(stbir_uint8 *)((long)outputp + 1) = sVar16;
      sVar16 = stbir__linear_to_srgb_uchar(encode[2]);
      *(stbir_uint8 *)((long)outputp + 2) = sVar16;
      sVar16 = stbir__linear_to_srgb_uchar(encode[3]);
      *(stbir_uint8 *)((long)outputp + 3) = sVar16;
      encode = encode + 4;
      outputp = (stbir_uint8 *)((long)outputp + 4);
    }
    for (; outputp < psVar5; outputp = (void *)((long)outputp + 1)) {
      sVar16 = stbir__linear_to_srgb_uchar(*encode);
      *(stbir_uint8 *)outputp = sVar16;
      encode = encode + 1;
    }
  }
  else {
    pauVar17 = (undefined1 (*) [16])(encode + (long)width_times_channels + -0x10);
    do {
      psVar1 = (stbir_uint8 *)((long)outputp + 0x10);
      psVar18 = psVar5 + -0x10;
      if (psVar1 == psVar5) {
        psVar18 = psVar1;
      }
      pauVar2 = (undefined1 (*) [16])((long)encode + 0x40);
      auVar23 = *(undefined1 (*) [16])encode;
      pauVar3 = (undefined1 (*) [16])((long)encode + 0x10);
      pauVar6 = (undefined1 (*) [16])((long)encode + 0x10);
      pauVar7 = (undefined1 (*) [16])((long)encode + 0x10);
      pauVar8 = (undefined1 (*) [16])((long)encode + 0x10);
      auVar26 = *(undefined1 (*) [16])((long)encode + 0x20);
      pauVar4 = (undefined1 (*) [16])((long)encode + 0x30);
      pauVar9 = (undefined1 (*) [16])((long)encode + 0x30);
      pauVar10 = (undefined1 (*) [16])((long)encode + 0x30);
      pauVar11 = (undefined1 (*) [16])((long)encode + 0x30);
      encode = (float *)pauVar17;
      if (psVar1 == psVar5) {
        encode = (float *)pauVar2;
      }
      if (psVar1 <= psVar5 + -0x10) {
        encode = (float *)pauVar2;
        psVar18 = psVar1;
      }
      auVar51._8_4_ = auVar23._4_4_;
      auVar51._0_8_ = auVar23._0_8_;
      auVar51._12_4_ = *(undefined4 *)(*pauVar6 + 4);
      auVar46._4_4_ = *(undefined4 *)*pauVar3;
      auVar46._0_4_ = auVar23._0_4_;
      auVar44._8_4_ = auVar26._4_4_;
      auVar44._0_8_ = auVar26._0_8_;
      auVar44._12_4_ = *(undefined4 *)(*pauVar9 + 4);
      auVar45._8_8_ = auVar44._8_8_;
      auVar46._12_4_ = *(undefined4 *)*pauVar4;
      auVar46._8_4_ = auVar26._0_4_;
      auVar49._0_8_ = CONCAT44(*(undefined4 *)(*pauVar7 + 8),auVar23._8_4_);
      auVar49._8_4_ = auVar23._12_4_;
      auVar49._12_4_ = *(undefined4 *)(*pauVar8 + 0xc);
      auVar23._0_8_ = CONCAT44(*(undefined4 *)(*pauVar10 + 8),auVar26._8_4_);
      auVar23._8_4_ = auVar26._12_4_;
      auVar23._12_4_ = *(undefined4 *)(*pauVar11 + 0xc);
      auVar45._0_8_ = auVar51._8_8_;
      auVar33._8_8_ = auVar23._0_8_;
      auVar33._0_8_ = auVar49._0_8_;
      auVar26._8_8_ = auVar23._8_8_;
      auVar26._0_8_ = auVar49._8_8_;
      auVar23 = maxps(auVar46,auVar12);
      auVar24 = minps(auVar23,auVar13);
      auVar23 = maxps(auVar45,auVar12);
      auVar46 = minps(auVar23,auVar13);
      auVar23 = maxps(auVar33,auVar12);
      auVar34 = minps(auVar23,auVar13);
      auVar23 = maxps(auVar26,auVar12);
      auVar23 = minps(auVar23,auVar13);
      auVar50._12_4_ =
           *(undefined4 *)
            (SrgbTransform::SRGB_8BIT_TO_LINEAR_FLOAT + (ulong)(auVar24._12_4_ >> 0x14) * 4 + 0x1c0)
      ;
      auVar50._8_4_ =
           *(undefined4 *)
            (SrgbTransform::SRGB_8BIT_TO_LINEAR_FLOAT + (ulong)(auVar24._8_4_ >> 0x14) * 4 + 0x1c0);
      auVar50._4_4_ =
           *(undefined4 *)
            (SrgbTransform::SRGB_8BIT_TO_LINEAR_FLOAT + (ulong)(auVar24._4_4_ >> 0x14) * 4 + 0x1c0);
      auVar50._0_4_ =
           *(undefined4 *)
            (SrgbTransform::SRGB_8BIT_TO_LINEAR_FLOAT + (ulong)(auVar24._0_4_ >> 0x14) * 4 + 0x1c0);
      auVar53._12_4_ =
           *(undefined4 *)
            (SrgbTransform::SRGB_8BIT_TO_LINEAR_FLOAT + (ulong)(auVar46._12_4_ >> 0x14) * 4 + 0x1c0)
      ;
      auVar53._8_4_ =
           *(undefined4 *)
            (SrgbTransform::SRGB_8BIT_TO_LINEAR_FLOAT + (ulong)(auVar46._8_4_ >> 0x14) * 4 + 0x1c0);
      auVar53._4_4_ =
           *(undefined4 *)
            (SrgbTransform::SRGB_8BIT_TO_LINEAR_FLOAT + (ulong)(auVar46._4_4_ >> 0x14) * 4 + 0x1c0);
      auVar53._0_4_ =
           *(undefined4 *)
            (SrgbTransform::SRGB_8BIT_TO_LINEAR_FLOAT + (ulong)(auVar46._0_4_ >> 0x14) * 4 + 0x1c0);
      auVar54._12_4_ =
           *(undefined4 *)
            (SrgbTransform::SRGB_8BIT_TO_LINEAR_FLOAT + (ulong)(auVar34._12_4_ >> 0x14) * 4 + 0x1c0)
      ;
      auVar54._8_4_ =
           *(undefined4 *)
            (SrgbTransform::SRGB_8BIT_TO_LINEAR_FLOAT + (ulong)(auVar34._8_4_ >> 0x14) * 4 + 0x1c0);
      auVar54._4_4_ =
           *(undefined4 *)
            (SrgbTransform::SRGB_8BIT_TO_LINEAR_FLOAT + (ulong)(auVar34._4_4_ >> 0x14) * 4 + 0x1c0);
      auVar54._0_4_ =
           *(undefined4 *)
            (SrgbTransform::SRGB_8BIT_TO_LINEAR_FLOAT + (ulong)(auVar34._0_4_ >> 0x14) * 4 + 0x1c0);
      auVar52._12_4_ =
           *(undefined4 *)
            (SrgbTransform::SRGB_8BIT_TO_LINEAR_FLOAT + (ulong)(auVar23._12_4_ >> 0x14) * 4 + 0x1c0)
      ;
      auVar52._8_4_ =
           *(undefined4 *)
            (SrgbTransform::SRGB_8BIT_TO_LINEAR_FLOAT + (ulong)(auVar23._8_4_ >> 0x14) * 4 + 0x1c0);
      auVar52._4_4_ =
           *(undefined4 *)
            (SrgbTransform::SRGB_8BIT_TO_LINEAR_FLOAT + (ulong)(auVar23._4_4_ >> 0x14) * 4 + 0x1c0);
      auVar52._0_4_ =
           *(undefined4 *)
            (SrgbTransform::SRGB_8BIT_TO_LINEAR_FLOAT + (ulong)(auVar23._0_4_ >> 0x14) * 4 + 0x1c0);
      auVar25._0_4_ = auVar24._0_4_ >> 0xc;
      auVar25._4_4_ = auVar24._4_4_ >> 0xc;
      auVar25._8_4_ = auVar24._8_4_ >> 0xc;
      auVar25._12_4_ = auVar24._12_4_ >> 0xc;
      auVar26 = pmaddwd(auVar25 & auVar14 | auVar15,auVar50);
      auVar27._0_4_ = auVar26._0_4_ >> 0x10;
      auVar27._4_4_ = auVar26._4_4_ >> 0x10;
      auVar27._8_4_ = auVar26._8_4_ >> 0x10;
      auVar27._12_4_ = auVar26._12_4_ >> 0x10;
      auVar47._0_4_ = auVar46._0_4_ >> 0xc;
      auVar47._4_4_ = auVar46._4_4_ >> 0xc;
      auVar47._8_4_ = auVar46._8_4_ >> 0xc;
      auVar47._12_4_ = auVar46._12_4_ >> 0xc;
      auVar26 = pmaddwd(auVar47 & auVar14 | auVar15,auVar53);
      auVar48._0_4_ = auVar26._0_4_ >> 0x10;
      auVar48._4_4_ = auVar26._4_4_ >> 0x10;
      auVar48._8_4_ = auVar26._8_4_ >> 0x10;
      auVar48._12_4_ = auVar26._12_4_ >> 0x10;
      auVar26 = packssdw(auVar27,auVar48);
      auVar35._0_4_ = auVar34._0_4_ >> 0xc;
      auVar35._4_4_ = auVar34._4_4_ >> 0xc;
      auVar35._8_4_ = auVar34._8_4_ >> 0xc;
      auVar35._12_4_ = auVar34._12_4_ >> 0xc;
      auVar24 = pmaddwd(auVar35 & auVar14 | auVar15,auVar54);
      auVar36._0_4_ = auVar24._0_4_ >> 0x10;
      auVar36._4_4_ = auVar24._4_4_ >> 0x10;
      auVar36._8_4_ = auVar24._8_4_ >> 0x10;
      auVar36._12_4_ = auVar24._12_4_ >> 0x10;
      auVar24._0_4_ = auVar23._0_4_ >> 0xc;
      auVar24._4_4_ = auVar23._4_4_ >> 0xc;
      auVar24._8_4_ = auVar23._8_4_ >> 0xc;
      auVar24._12_4_ = auVar23._12_4_ >> 0xc;
      auVar23 = pmaddwd(auVar24 & auVar14 | auVar15,auVar52);
      auVar34._0_4_ = auVar23._0_4_ >> 0x10;
      auVar34._4_4_ = auVar23._4_4_ >> 0x10;
      auVar34._8_4_ = auVar23._8_4_ >> 0x10;
      auVar34._12_4_ = auVar23._12_4_ >> 0x10;
      auVar23 = packssdw(auVar36,auVar34);
      sVar39 = auVar23._6_2_;
      sVar22 = auVar26._6_2_;
      sVar38 = auVar23._4_2_;
      sVar21 = auVar26._4_2_;
      sVar37 = auVar23._2_2_;
      sVar20 = auVar26._2_2_;
      sVar19 = auVar26._0_2_;
      sVar32 = auVar23._0_2_;
      sVar28 = auVar26._8_2_;
      sVar40 = auVar23._8_2_;
      sVar29 = auVar26._10_2_;
      sVar41 = auVar23._10_2_;
      sVar30 = auVar26._12_2_;
      sVar42 = auVar23._12_2_;
      sVar31 = auVar26._14_2_;
      sVar43 = auVar23._14_2_;
      *(char *)outputp = (0 < sVar19) * (sVar19 < 0x100) * auVar26[0] - (0xff < sVar19);
      *(char *)((long)outputp + 1) = (0 < sVar28) * (sVar28 < 0x100) * auVar26[8] - (0xff < sVar28);
      *(char *)((long)outputp + 2) = (0 < sVar32) * (sVar32 < 0x100) * auVar23[0] - (0xff < sVar32);
      *(char *)((long)outputp + 3) = (0 < sVar40) * (sVar40 < 0x100) * auVar23[8] - (0xff < sVar40);
      *(char *)((long)outputp + 4) = (0 < sVar20) * (sVar20 < 0x100) * auVar26[2] - (0xff < sVar20);
      *(char *)((long)outputp + 5) = (0 < sVar29) * (sVar29 < 0x100) * auVar26[10] - (0xff < sVar29)
      ;
      *(char *)((long)outputp + 6) = (0 < sVar37) * (sVar37 < 0x100) * auVar23[2] - (0xff < sVar37);
      *(char *)((long)outputp + 7) = (0 < sVar41) * (sVar41 < 0x100) * auVar23[10] - (0xff < sVar41)
      ;
      *(char *)((long)outputp + 8) = (0 < sVar21) * (sVar21 < 0x100) * auVar26[4] - (0xff < sVar21);
      *(char *)((long)outputp + 9) =
           (0 < sVar30) * (sVar30 < 0x100) * auVar26[0xc] - (0xff < sVar30);
      *(char *)((long)outputp + 10) = (0 < sVar38) * (sVar38 < 0x100) * auVar23[4] - (0xff < sVar38)
      ;
      *(char *)((long)outputp + 0xb) =
           (0 < sVar42) * (sVar42 < 0x100) * auVar23[0xc] - (0xff < sVar42);
      *(char *)((long)outputp + 0xc) =
           (0 < sVar22) * (sVar22 < 0x100) * auVar26[6] - (0xff < sVar22);
      *(char *)((long)outputp + 0xd) =
           (0 < sVar31) * (sVar31 < 0x100) * auVar26[0xe] - (0xff < sVar31);
      *(char *)((long)outputp + 0xe) =
           (0 < sVar39) * (sVar39 < 0x100) * auVar23[6] - (0xff < sVar39);
      *(char *)((long)outputp + 0xf) =
           (0 < sVar43) * (sVar43 < 0x100) * auVar23[0xe] - (0xff < sVar43);
      outputp = psVar18;
    } while (psVar1 != psVar5);
  }
  return;
}

Assistant:

static void STBIR__CODER_NAME( stbir__encode_uint8_srgb )( void * outputp, int width_times_channels, float const * encode )
{
  unsigned char STBIR_SIMD_STREAMOUT_PTR( * ) output = (unsigned char*) outputp;
  unsigned char * end_output = ( (unsigned char*) output ) + width_times_channels;

  #ifdef STBIR_SIMD

  if ( width_times_channels >= 16 )
  {
    float const * end_encode_m16 = encode + width_times_channels - 16;
    end_output -= 16;
    STBIR_SIMD_NO_UNROLL_LOOP_START_INF_FOR
    for(;;)
    {
      stbir__simdf f0, f1, f2, f3;
      stbir__simdi i0, i1, i2, i3;
      STBIR_SIMD_NO_UNROLL(encode);

      stbir__simdf_load4_transposed( f0, f1, f2, f3, encode );

      stbir__min_max_shift20( i0, f0 );
      stbir__min_max_shift20( i1, f1 );
      stbir__min_max_shift20( i2, f2 );
      stbir__min_max_shift20( i3, f3 );

      stbir__simdi_table_lookup4( i0, i1, i2, i3, ( fp32_to_srgb8_tab4 - (127-13)*8 ) );

      stbir__linear_to_srgb_finish( i0, f0 );
      stbir__linear_to_srgb_finish( i1, f1 );
      stbir__linear_to_srgb_finish( i2, f2 );
      stbir__linear_to_srgb_finish( i3, f3 );

      stbir__interleave_pack_and_store_16_u8( output,  STBIR_strs_join1(i, ,stbir__encode_order0), STBIR_strs_join1(i, ,stbir__encode_order1), STBIR_strs_join1(i, ,stbir__encode_order2), STBIR_strs_join1(i, ,stbir__encode_order3) );

      encode += 16;
      output += 16;
      if ( output <= end_output )
        continue;
      if ( output == ( end_output + 16 ) )
        break;
      output = end_output; // backup and do last couple
      encode = end_encode_m16;
    }
    return;
  }
  #endif

  // try to do blocks of 4 when you can
  #if stbir__coder_min_num != 3 // doesn't divide cleanly by four
  output += 4;
  STBIR_SIMD_NO_UNROLL_LOOP_START
  while ( output <= end_output )
  {
    STBIR_SIMD_NO_UNROLL(encode);

    output[0-4] = stbir__linear_to_srgb_uchar( encode[stbir__encode_order0] );
    output[1-4] = stbir__linear_to_srgb_uchar( encode[stbir__encode_order1] );
    output[2-4] = stbir__linear_to_srgb_uchar( encode[stbir__encode_order2] );
    output[3-4] = stbir__linear_to_srgb_uchar( encode[stbir__encode_order3] );

    output += 4;
    encode += 4;
  }
  output -= 4;
  #endif

  // do the remnants
  #if stbir__coder_min_num < 4
  STBIR_NO_UNROLL_LOOP_START
  while( output < end_output )
  {
    STBIR_NO_UNROLL(encode);
    output[0] = stbir__linear_to_srgb_uchar( encode[stbir__encode_order0] );
    #if stbir__coder_min_num >= 2
    output[1] = stbir__linear_to_srgb_uchar( encode[stbir__encode_order1] );
    #endif
    #if stbir__coder_min_num >= 3
    output[2] = stbir__linear_to_srgb_uchar( encode[stbir__encode_order2] );
    #endif
    output += stbir__coder_min_num;
    encode += stbir__coder_min_num;
  }
  #endif
}